

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O0

void pre_process_data(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                     JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr,
                     JDIMENSION out_row_groups_avail)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint in_ECX;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  uint *in_R9;
  jpeg_component_info *compptr;
  JDIMENSION inrows;
  int ci;
  int numrows;
  my_prep_ptr prep;
  uint in_stack_ffffffffffffffac;
  JSAMPARRAY in_stack_ffffffffffffffb0;
  JSAMPARRAY image_data;
  int local_40;
  
  lVar1 = *(long *)(in_RDI + 0x200);
  do {
    uVar2 = in_stack_ffffffffffffffac & 0xffffff;
    if (*in_RDX < in_ECX) {
      uVar2 = CONCAT13(*in_R9 < (uint)compptr,(int3)in_stack_ffffffffffffffac);
    }
    in_stack_ffffffffffffffac = uVar2;
    if ((char)(in_stack_ffffffffffffffac >> 0x18) == '\0') {
      return;
    }
    uVar2 = in_ECX - *in_RDX;
    uVar3 = *(int *)(in_RDI + 0x160) - *(int *)(lVar1 + 100);
    if (uVar3 < uVar2) {
      uVar2 = uVar3;
    }
    uVar3 = uVar2;
    (**(code **)(*(long *)(in_RDI + 0x218) + 8))
              (in_RDI,in_RSI + (ulong)*in_RDX * 8,lVar1 + 0x10,*(undefined4 *)(lVar1 + 100),uVar2);
    *in_RDX = uVar2 + *in_RDX;
    *(uint *)(lVar1 + 100) = uVar2 + *(int *)(lVar1 + 100);
    *(uint *)(lVar1 + 0x60) = *(int *)(lVar1 + 0x60) - uVar2;
    if ((*(int *)(lVar1 + 0x60) == 0) && (*(int *)(lVar1 + 100) < *(int *)(in_RDI + 0x160))) {
      for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x5c); local_40 = local_40 + 1) {
        expand_bottom_edge(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,uVar3,0);
      }
      *(undefined4 *)(lVar1 + 100) = *(undefined4 *)(in_RDI + 0x160);
    }
    if (*(int *)(lVar1 + 100) == *(int *)(in_RDI + 0x160)) {
      (**(code **)(*(long *)(in_RDI + 0x220) + 8))(in_RDI,lVar1 + 0x10,0,in_R8,*in_R9);
      *(undefined4 *)(lVar1 + 100) = 0;
      *in_R9 = *in_R9 + 1;
    }
  } while ((*(int *)(lVar1 + 0x60) != 0) || ((uint)compptr <= *in_R9));
  local_40 = 0;
  image_data = *(JSAMPARRAY *)(in_RDI + 0x68);
  for (; local_40 < *(int *)(in_RDI + 0x5c); local_40 = local_40 + 1) {
    expand_bottom_edge(image_data,in_stack_ffffffffffffffac,uVar3,0);
    image_data = image_data + 0xc;
  }
  *in_R9 = (uint)compptr;
  return;
}

Assistant:

METHODDEF(void)
pre_process_data (j_compress_ptr cinfo,
		  JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		  JDIMENSION in_rows_avail,
		  JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		  JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  JDIMENSION inrows;
  jpeg_component_info * compptr;

  while (*in_row_ctr < in_rows_avail &&
	 *out_row_group_ctr < out_row_groups_avail) {
    /* Do color conversion to fill the conversion buffer. */
    inrows = in_rows_avail - *in_row_ctr;
    numrows = cinfo->max_v_samp_factor - prep->next_buf_row;
    numrows = (int) MIN((JDIMENSION) numrows, inrows);
    (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
				       prep->color_buf,
				       (JDIMENSION) prep->next_buf_row,
				       numrows);
    *in_row_ctr += numrows;
    prep->next_buf_row += numrows;
    prep->rows_to_go -= numrows;
    /* If at bottom of image, pad to fill the conversion buffer. */
    if (prep->rows_to_go == 0 &&
	prep->next_buf_row < cinfo->max_v_samp_factor) {
      for (ci = 0; ci < cinfo->num_components; ci++) {
	expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			   prep->next_buf_row, cinfo->max_v_samp_factor);
      }
      prep->next_buf_row = cinfo->max_v_samp_factor;
    }
    /* If we've filled the conversion buffer, empty it. */
    if (prep->next_buf_row == cinfo->max_v_samp_factor) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf, (JDIMENSION) 0,
					output_buf, *out_row_group_ctr);
      prep->next_buf_row = 0;
      (*out_row_group_ctr)++;
    }
    /* If at bottom of image, pad the output to a full iMCU height.
     * Note we assume the caller is providing a one-iMCU-height output buffer!
     */
    if (prep->rows_to_go == 0 &&
	*out_row_group_ctr < out_row_groups_avail) {
      for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	   ci++, compptr++) {
	numrows = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		  cinfo->min_DCT_v_scaled_size;
	expand_bottom_edge(output_buf[ci],
			   compptr->width_in_blocks * compptr->DCT_h_scaled_size,
			   (int) (*out_row_group_ctr * numrows),
			   (int) (out_row_groups_avail * numrows));
      }
      *out_row_group_ctr = out_row_groups_avail;
      break;			/* can exit outer loop without test */
    }
  }
}